

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdCircularList.h
# Opt level: O1

double __thiscall HACD::ICHUll::ComputeVolume(ICHUll *this)

{
  size_t sVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  CircularListElement<HACD::TMMVertex> *pCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  CircularListElement<HACD::TMMVertex> *pCVar10;
  CircularListElement<HACD::TMMTriangle> *pCVar11;
  size_t sVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 in_ZMM3 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  sVar1 = (this->m_mesh).m_vertices.m_size;
  dVar13 = 0.0;
  dVar16 = 0.0;
  if ((sVar1 != 0) && (this->m_isFlat == false)) {
    pCVar10 = (this->m_mesh).m_vertices.m_head;
    dVar15 = 0.0;
    dVar14 = 0.0;
    sVar12 = sVar1;
    do {
      dVar14 = dVar14 + (pCVar10->m_data).m_pos.m_data[0];
      dVar15 = dVar15 + (pCVar10->m_data).m_pos.m_data[1];
      dVar16 = dVar16 + (pCVar10->m_data).m_pos.m_data[2];
      pCVar10 = pCVar10->m_next;
      (this->m_mesh).m_vertices.m_head = pCVar10;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
    sVar12 = (this->m_mesh).m_triangles.m_size;
    if (sVar12 == 0) {
      return 0.0;
    }
    auVar22 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,sVar1);
    dVar13 = auVar22._0_8_;
    dVar14 = dVar14 / dVar13;
    dVar15 = dVar15 / dVar13;
    dVar16 = dVar16 / dVar13;
    pCVar11 = (this->m_mesh).m_triangles.m_head;
    dVar13 = 0.0;
    do {
      pCVar10 = (pCVar11->m_data).m_vertices[0];
      pCVar2 = (pCVar11->m_data).m_vertices[1];
      pCVar3 = (pCVar11->m_data).m_vertices[2];
      dVar4 = (pCVar2->m_data).m_pos.m_data[0] - dVar14;
      dVar5 = (pCVar2->m_data).m_pos.m_data[1] - dVar15;
      dVar6 = (pCVar2->m_data).m_pos.m_data[2] - dVar16;
      dVar7 = (pCVar3->m_data).m_pos.m_data[0] - dVar14;
      dVar8 = (pCVar3->m_data).m_pos.m_data[1] - dVar15;
      dVar9 = (pCVar3->m_data).m_pos.m_data[2] - dVar16;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar5;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar9;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar8 * dVar6;
      auVar22 = vfmsub231sd_fma(auVar28,auVar22,auVar26);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar6;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar7;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar9 * dVar4;
      auVar18 = vfmsub231sd_fma(auVar27,auVar24,auVar23);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (pCVar10->m_data).m_pos.m_data[0] - dVar14;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auVar18._0_8_ * ((pCVar10->m_data).m_pos.m_data[1] - dVar15);
      auVar22 = vfmadd231sd_fma(auVar19,auVar17,auVar22);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar7 * dVar5;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar4;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar8;
      auVar18 = vfmsub231sd_fma(auVar18,auVar21,auVar25);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (pCVar10->m_data).m_pos.m_data[2] - dVar16;
      auVar22 = vfmadd213sd_fma(auVar18,auVar20,auVar22);
      dVar13 = dVar13 + auVar22._0_8_;
      pCVar11 = pCVar11->m_next;
      (this->m_mesh).m_triangles.m_head = pCVar11;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  return dVar13;
}

Assistant:

size_t                                  GetSize() const { return m_size; }